

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedOutput.cpp
# Opt level: O2

void __thiscall
Test::SynchronizedOutput::finishSuite
          (SynchronizedOutput *this,string *suiteName,uint numTests,uint numPositiveTests,
          microseconds totalDuration)

{
  std::mutex::lock(&this->outputMutex);
  (*this->realOutput->_vptr_Output[3])
            (this->realOutput,suiteName,(ulong)numTests,(ulong)numPositiveTests,totalDuration.__r);
  pthread_mutex_unlock((pthread_mutex_t *)&this->outputMutex);
  return;
}

Assistant:

void SynchronizedOutput::finishSuite(const std::string &suiteName, const unsigned int numTests,
    const unsigned int numPositiveTests, const std::chrono::microseconds totalDuration) {
  std::lock_guard<std::mutex> guard(outputMutex);
  realOutput.finishSuite(suiteName, numTests, numPositiveTests, totalDuration);
}